

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddReorder.c
# Opt level: O3

Move * ddSiftingUp(DdManager *table,int y,int xLow)

{
  int y_00;
  int iVar1;
  int iVar2;
  int iVar3;
  DdNode *pDVar4;
  Move *pMVar5;
  long lVar6;
  DdHalfWord x;
  long lVar7;
  long lVar8;
  DdNode *pDVar9;
  DdNode *pDVar10;
  int iVar11;
  int iVar12;
  long local_58;
  
  lVar6 = (long)y;
  iVar11 = table->keys - table->isolated;
  y_00 = table->invperm[lVar6];
  iVar12 = iVar11;
  if (xLow + 1 < y) {
    lVar8 = (long)xLow;
    lVar7 = lVar8 * 0xe + 0x12;
    do {
      iVar1 = table->invperm[lVar8 + 1];
      iVar2 = cuddTestInteract(table,iVar1,y_00);
      if (iVar2 != 0) {
        iVar12 = (iVar12 + (uint)(table->vars[iVar1]->ref == 1)) -
                 *(int *)((long)&table->subtables->nodelist + lVar7 * 4);
      }
      lVar8 = lVar8 + 1;
      lVar7 = lVar7 + 0xe;
    } while (y + -1 != (int)lVar8);
  }
  pMVar5 = (Move *)0x0;
  if ((xLow < y) &&
     (iVar12 = (iVar12 + (uint)(table->vars[y_00]->ref == 1)) - table->subtables[lVar6].keys,
     iVar12 <= iVar11)) {
    local_58 = lVar6 * 0xe + 4;
    pDVar9 = (DdNode *)0x0;
    while( true ) {
      lVar6 = lVar6 + -1;
      x = y - 1;
      iVar1 = table->invperm[lVar6];
      iVar2 = cuddSwapInPlace(table,x,y);
      if (iVar2 == 0) break;
      iVar3 = cuddTestInteract(table,iVar1,y_00);
      if (iVar3 != 0) {
        iVar12 = (iVar12 - (uint)(table->vars[iVar1]->ref == 1)) +
                 *(int *)((long)&table->subtables->nodelist + local_58 * 4);
      }
      pDVar4 = cuddDynamicAllocNode(table);
      if (pDVar4 == (DdNode *)0x0) break;
      pDVar4->index = x;
      pDVar4->ref = y;
      *(int *)((long)&pDVar4->next + 4) = iVar2;
      (pDVar4->type).kids.T = pDVar9;
      if ((double)iVar11 * table->maxGrowth < (double)iVar2) {
        return (Move *)pDVar4;
      }
      if (iVar2 < iVar11) {
        iVar11 = iVar2;
      }
      if (lVar6 <= xLow) {
        return (Move *)pDVar4;
      }
      local_58 = local_58 + -0xe;
      pDVar9 = pDVar4;
      y = x;
      if (iVar11 < iVar12) {
        return (Move *)pDVar4;
      }
    }
    pMVar5 = (Move *)0xffffffffffffffff;
    if (pDVar9 != (DdNode *)0x0) {
      pDVar4 = table->nextFree;
      do {
        pDVar10 = pDVar9;
        pDVar9 = (pDVar10->type).kids.T;
        pDVar10->ref = 0;
        pDVar10->next = pDVar4;
        pDVar4 = pDVar10;
      } while (pDVar9 != (DdNode *)0x0);
      table->nextFree = pDVar10;
    }
  }
  return pMVar5;
}

Assistant:

static Move *
ddSiftingUp(
  DdManager * table,
  int  y,
  int  xLow)
{
    Move        *moves;
    Move        *move;
    int         x;
    int         size;
    int         limitSize;
    int         xindex, yindex;
    int         isolated;
    int         L;      /* lower bound on DD size */
#ifdef DD_DEBUG
    int checkL;
    int z;
    int zindex;
#endif

    moves = NULL;
    yindex = table->invperm[y];

    /* Initialize the lower bound.
    ** The part of the DD below y will not change.
    ** The part of the DD above y that does not interact with y will not
    ** change. The rest may vanish in the best case, except for
    ** the nodes at level xLow, which will not vanish, regardless.
    */
    limitSize = L = table->keys - table->isolated;
    for (x = xLow + 1; x < y; x++) {
        xindex = table->invperm[x];
        if (cuddTestInteract(table,xindex,yindex)) {
            isolated = table->vars[xindex]->ref == 1;
            L -= table->subtables[x].keys - isolated;
        }
    }
    isolated = table->vars[yindex]->ref == 1;
    L -= table->subtables[y].keys - isolated;

    x = cuddNextLow(table,y);
    while (x >= xLow && L <= limitSize) {
        xindex = table->invperm[x];
#ifdef DD_DEBUG
        checkL = table->keys - table->isolated;
        for (z = xLow + 1; z < y; z++) {
            zindex = table->invperm[z];
            if (cuddTestInteract(table,zindex,yindex)) {
                isolated = table->vars[zindex]->ref == 1;
                checkL -= table->subtables[z].keys - isolated;
            }
        }
        isolated = table->vars[yindex]->ref == 1;
        checkL -= table->subtables[y].keys - isolated;
        assert(L == checkL);
#endif
        size = cuddSwapInPlace(table,x,y);
        if (size == 0) goto ddSiftingUpOutOfMem;
        /* Update the lower bound. */
        if (cuddTestInteract(table,xindex,yindex)) {
            isolated = table->vars[xindex]->ref == 1;
            L += table->subtables[y].keys - isolated;
        }
        move = (Move *) cuddDynamicAllocNode(table);
        if (move == NULL) goto ddSiftingUpOutOfMem;
        move->x = x;
        move->y = y;
        move->size = size;
        move->next = moves;
        moves = move;
        if ((double) size > (double) limitSize * table->maxGrowth) break;
        if (size < limitSize) limitSize = size;
        y = x;
        x = cuddNextLow(table,y);
    }
    return(moves);

ddSiftingUpOutOfMem:
    while (moves != NULL) {
        move = moves->next;
        cuddDeallocMove(table, moves);
        moves = move;
    }
    return((Move *) CUDD_OUT_OF_MEM);

}